

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string ** google::protobuf::internal::MakeDenseEnumCache_abi_cxx11_
                    (EnumDescriptor *desc,int min_val,int max_val)

{
  string **__s;
  EnumValueDescriptor *pEVar1;
  int iVar2;
  int index;
  int iVar3;
  ulong __n;
  long lVar4;
  
  iVar2 = max_val - min_val;
  __n = 0xffffffffffffffff;
  if (-2 < iVar2) {
    __n = (ulong)(iVar2 + 1) << 3;
  }
  __s = (string **)operator_new__(__n);
  index = 0;
  memset(__s,0,__n);
  iVar3 = desc->value_count_;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != index; index = index + 1) {
    pEVar1 = EnumDescriptor::value(desc,index);
    lVar4 = (long)pEVar1->number_ - (long)min_val;
    if (__s[lVar4] == (string *)0x0) {
      pEVar1 = EnumDescriptor::value(desc,index);
      __s[lVar4] = pEVar1->all_names_;
    }
  }
  for (lVar4 = 0; lVar4 <= iVar2; lVar4 = lVar4 + 1) {
    if (__s[lVar4] == (string *)0x0) {
      __s[lVar4] = (string *)&fixed_address_empty_string;
    }
  }
  return __s;
}

Assistant:

const std::string** MakeDenseEnumCache(const EnumDescriptor* desc, int min_val,
                                       int max_val) {
  auto* str_ptrs =
      new const std::string*[static_cast<size_t>(max_val - min_val + 1)]();
  const int count = desc->value_count();
  for (int i = 0; i < count; ++i) {
    const int num = desc->value(i)->number();
    if (str_ptrs[num - min_val] == nullptr) {
      // Don't over-write an existing entry, because in case of duplication, the
      // first one wins.
      str_ptrs[num - min_val] = &internal::NameOfEnumAsString(desc->value(i));
    }
  }
  // Change any unfilled entries to point to the empty string.
  for (int i = 0; i < max_val - min_val + 1; ++i) {
    if (str_ptrs[i] == nullptr) str_ptrs[i] = &GetEmptyStringAlreadyInited();
  }
  return str_ptrs;
}